

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

Id dxil_spv::build_rasterizer_sample_count(Impl *impl)

{
  uint value;
  Id IVar1;
  Builder *this;
  
  this = Converter::Impl::builder(impl);
  IVar1 = impl->rasterizer_sample_count_id;
  if (IVar1 == 0) {
    if ((impl->options).rasterizer_sample_count_spec_constant == true) {
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,1,true);
      impl->rasterizer_sample_count_id = IVar1;
      spv::Builder::addDecoration
                (this,IVar1,DecorationSpecId,(impl->options).rasterizer_sample_count);
      IVar1 = impl->rasterizer_sample_count_id;
    }
    else {
      value = (impl->options).rasterizer_sample_count;
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar1 = spv::Builder::makeIntConstant(this,IVar1,value,false);
      impl->rasterizer_sample_count_id = IVar1;
    }
  }
  return IVar1;
}

Assistant:

static spv::Id build_rasterizer_sample_count(Converter::Impl &impl)
{
	auto &builder = impl.builder();
	if (!impl.rasterizer_sample_count_id)
	{
		if (impl.options.rasterizer_sample_count_spec_constant)
		{
			impl.rasterizer_sample_count_id = builder.makeUintConstant(1, true);
			builder.addDecoration(impl.rasterizer_sample_count_id, spv::DecorationSpecId,
			                      impl.options.rasterizer_sample_count);
		}
		else
			impl.rasterizer_sample_count_id = builder.makeUintConstant(impl.options.rasterizer_sample_count, false);
	}
	return impl.rasterizer_sample_count_id;
}